

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O3

int kiss_fft_next_fast_size(int n)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = n;
  do {
    do {
      uVar3 = uVar2;
      uVar1 = n;
      n = (int)uVar1 >> 1;
      uVar2 = uVar3;
    } while ((uVar1 & 1) == 0);
    for (; uVar1 * -0x55555555 + 0x2aaaaaaa < 0x55555555; uVar1 = (int)uVar1 / 3) {
    }
    for (; uVar1 * -0x33333333 + 0x19999999 < 0x33333333; uVar1 = (int)uVar1 / 5) {
    }
    n = uVar3 + 1;
    uVar2 = uVar3 + 1;
  } while (1 < (int)uVar1);
  return uVar3;
}

Assistant:

int kiss_fft_next_fast_size(int n)
{
    while(1) {
        int m=n;
        while ( (m%2) == 0 ) m/=2;
        while ( (m%3) == 0 ) m/=3;
        while ( (m%5) == 0 ) m/=5;
        if (m<=1)
            break; /* n is completely factorable by twos, threes, and fives */
        n++;
    }
    return n;
}